

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

void __thiscall cali::Caliper::begin(Caliper *this,Attribute *attr,Variant *data)

{
  pointer pCVar1;
  cali_id_t cVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  cali_id_t cVar6;
  Node *pNVar7;
  char cVar8;
  Channel *channel_1;
  pointer pCVar9;
  Channel *channel;
  mutex *__mutex;
  cali_id_t cVar10;
  Blackboard *pBVar11;
  element_type *local_60;
  uint local_54;
  ThreadData *local_50;
  Entry local_48;
  
  if (this->sT->stack_error == false) {
    local_54 = Attribute::properties(attr);
    local_50 = this->sT;
    (local_50->lock).m_lock = (local_50->lock).m_lock + 1;
    if ((local_54 & 0x40) == 0) {
      pCVar9 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar1 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar9 != pCVar1) {
        do {
          local_60 = (pCVar9->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
          local_48.m_node = (Node *)this;
          util::
          callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
          ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                        *)&(((pCVar9->mP).
                             super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->events).pre_begin_evt,(Caliper **)&local_48,&local_60,attr,data
                      );
          pCVar9 = pCVar9 + 1;
        } while (pCVar9 != pCVar1);
      }
    }
    uVar3 = local_54;
    cVar8 = (char)local_54;
    if ((local_54 & 0x3c) == 0xc) {
      __mutex = &this->sG->process_blackboard_lock;
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      pBVar11 = &this->sG->process_blackboard;
      if ((uVar3 & 1) == 0) {
        cVar10 = (ulong)((uVar3 >> 10 & 1) != 0) + 1;
        cVar6 = cVar10;
        do {
          uVar5 = (ulong)(uint)(((int)cVar6 + (int)(cVar6 / 0x3fd) * -0x3fd) * 0x20);
          cVar2 = *(cali_id_t *)((long)&pBVar11->hashtable[0].key + uVar5);
          if (cVar2 == cVar10) break;
          cVar6 = cVar6 % 0x3fd + 1;
        } while (cVar2 != 0xffffffffffffffff);
        if (cVar2 == cVar10) {
          pNVar7 = *(Node **)((long)&pBVar11->hashtable[0].value.m_node + uVar5);
        }
        else {
          pNVar7 = (Node *)0x0;
        }
        local_48.m_node = internal::MetadataTree::get_child(&this->sT->tree,attr,data,pNVar7);
        local_48.m_value.m_v.type_and_size = ((local_48.m_node)->m_data).m_v.type_and_size;
        local_48.m_value.m_v.value = ((local_48.m_node)->m_data).m_v.value;
        Blackboard::set(pBVar11,cVar10,&local_48,-1 < cVar8);
      }
      else {
        local_48.m_node = attr->m_node;
        if (local_48.m_node == (Node *)0x0) {
          cVar6 = 0xffffffffffffffff;
        }
        else {
          cVar6 = (local_48.m_node)->m_id;
        }
        local_48.m_value.m_v.type_and_size = (data->m_v).type_and_size;
        local_48.m_value.m_v.value = (data->m_v).value;
        Blackboard::set(pBVar11,cVar6,&local_48,-1 < cVar8);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else if ((local_54 & 0x3c) == 0x14) {
      pBVar11 = &this->sT->thread_blackboard;
      if ((local_54 & 1) == 0) {
        cVar10 = (ulong)((local_54 >> 10 & 1) != 0) + 1;
        cVar6 = cVar10;
        do {
          uVar5 = (ulong)(uint)(((int)cVar6 + (int)(cVar6 / 0x3fd) * -0x3fd) * 0x20);
          cVar2 = *(cali_id_t *)((long)&pBVar11->hashtable[0].key + uVar5);
          if (cVar2 == cVar10) break;
          cVar6 = cVar6 % 0x3fd + 1;
        } while (cVar2 != 0xffffffffffffffff);
        if (cVar2 == cVar10) {
          pNVar7 = *(Node **)((long)&pBVar11->hashtable[0].value.m_node + uVar5);
        }
        else {
          pNVar7 = (Node *)0x0;
        }
        local_48.m_node = internal::MetadataTree::get_child(&this->sT->tree,attr,data,pNVar7);
        local_48.m_value.m_v.type_and_size = ((local_48.m_node)->m_data).m_v.type_and_size;
        local_48.m_value.m_v.value = ((local_48.m_node)->m_data).m_v.value;
        Blackboard::set(pBVar11,cVar10,&local_48,-1 < cVar8);
      }
      else {
        local_48.m_node = attr->m_node;
        if (local_48.m_node == (Node *)0x0) {
          cVar6 = 0xffffffffffffffff;
        }
        else {
          cVar6 = (local_48.m_node)->m_id;
        }
        local_48.m_value.m_v.type_and_size = (data->m_v).type_and_size;
        local_48.m_value.m_v.value = (data->m_v).value;
        Blackboard::set(pBVar11,cVar6,&local_48,-1 < cVar8);
      }
    }
    if ((uVar3 & 0x40) == 0) {
      pCVar9 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar1 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar9 != pCVar1) {
        do {
          local_60 = (pCVar9->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
          local_48.m_node = (Node *)this;
          util::
          callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
          ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                        *)&(local_60->events).post_begin_evt,(Caliper **)&local_48,&local_60,attr,
                       data);
          pCVar9 = pCVar9 + 1;
        } while (pCVar9 != pCVar1);
      }
    }
    (local_50->lock).m_lock = (local_50->lock).m_lock + -1;
  }
  return;
}

Assistant:

void Caliper::begin(const Attribute& attr, const Variant& data)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    std::lock_guard<::siglock> g(sT->lock);

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_begin_evt(this, channel.body(), attr, data);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_begin(attr, data, prop, sT->thread_blackboard, sT->tree);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_begin(attr, data, prop, sG->process_blackboard, sT->tree);
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.post_begin_evt(this, channel.body(), attr, data);
}